

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::ExtensionRangeOptions::MergeFrom(ExtensionRangeOptions *this,Message *from)

{
  ExtensionRangeOptions *from_00;
  
  from_00 = DynamicCastToGenerated<google::protobuf::ExtensionRangeOptions>(from);
  if (from_00 != (ExtensionRangeOptions *)0x0) {
    MergeFrom(this,from_00);
    return;
  }
  internal::ReflectionOps::Merge(from,&this->super_Message);
  return;
}

Assistant:

void ExtensionRangeOptions::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.ExtensionRangeOptions)
  GOOGLE_DCHECK_NE(&from, this);
  const ExtensionRangeOptions* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<ExtensionRangeOptions>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.ExtensionRangeOptions)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.ExtensionRangeOptions)
    MergeFrom(*source);
  }
}